

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_utf8.c
# Opt level: O0

void t14(void)

{
  byte bVar1;
  int iVar2;
  undefined8 uVar3;
  char *pcVar4;
  _Bool ok_5;
  _Bool ok_4;
  _Bool ok_3;
  _Bool ok_2;
  _Bool ok_1;
  _Bool ok;
  ALLEGRO_USTR *us1;
  
  uVar3 = al_ustr_new(anon_var_dwarf_3b4);
  bVar1 = al_ustr_truncate(uVar3,0x1e);
  if ((bVar1 & 1) == 0) {
    log_printf("FAIL %s\n","al_ustr_truncate(us1, 30)");
    error = error + 1;
  }
  else {
    log_printf("OK   %s\n","al_ustr_truncate(us1, 30)");
  }
  pcVar4 = (char *)al_cstr(uVar3);
  iVar2 = strcmp(pcVar4,anon_var_dwarf_4e6);
  if (iVar2 == 0) {
    log_printf("OK   %s\n",anon_var_dwarf_4fd);
  }
  else {
    log_printf("FAIL %s\n",anon_var_dwarf_4fd);
    error = error + 1;
  }
  bVar1 = al_ustr_truncate(uVar3,100);
  if ((bVar1 & 1) == 0) {
    log_printf("FAIL %s\n","al_ustr_truncate(us1, 100)");
    error = error + 1;
  }
  else {
    log_printf("OK   %s\n","al_ustr_truncate(us1, 100)");
  }
  pcVar4 = (char *)al_cstr(uVar3);
  iVar2 = strcmp(pcVar4,anon_var_dwarf_4e6);
  if (iVar2 == 0) {
    log_printf("OK   %s\n",anon_var_dwarf_4fd);
  }
  else {
    log_printf("FAIL %s\n",anon_var_dwarf_4fd);
    error = error + 1;
  }
  bVar1 = al_ustr_truncate(uVar3,0xffffffff);
  if (((bVar1 ^ 0xff) & 1) == 0) {
    log_printf("FAIL %s\n","! al_ustr_truncate(us1, -1)");
    error = error + 1;
  }
  else {
    log_printf("OK   %s\n","! al_ustr_truncate(us1, -1)");
  }
  pcVar4 = (char *)al_cstr(uVar3);
  iVar2 = strcmp(pcVar4,anon_var_dwarf_4e6);
  if (iVar2 == 0) {
    log_printf("OK   %s\n",anon_var_dwarf_4fd);
  }
  else {
    log_printf("FAIL %s\n",anon_var_dwarf_4fd);
    error = error + 1;
  }
  al_ustr_free(uVar3);
  return;
}

Assistant:

static void t14(void)
{
   ALLEGRO_USTR *us1 = al_ustr_new("aábdðeéfghiíjkprstuúvxyýþæö");

   /* Truncate from middle of string. */
   CHECK(al_ustr_truncate(us1, 30));
   CHECK(0 == strcmp(al_cstr(us1), "aábdðeéfghiíjkprstuúvxyý"));

   /* Truncate past end (allowed). */
   CHECK(al_ustr_truncate(us1, 100));
   CHECK(0 == strcmp(al_cstr(us1), "aábdðeéfghiíjkprstuúvxyý"));

   /* Truncate before start (not allowed). */
   CHECK(! al_ustr_truncate(us1, -1));
   CHECK(0 == strcmp(al_cstr(us1), "aábdðeéfghiíjkprstuúvxyý"));

   al_ustr_free(us1);
}